

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O1

void __thiscall
deqp::sl::ShaderParser::parseShaderCase
          (ShaderParser *this,
          vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *shaderNodeList)

{
  string *__rhs;
  Token TVar1;
  pointer pcVar2;
  int iVar3;
  GLSLVersion targetVersion;
  ShaderCase *pSVar4;
  undefined8 extraout_RAX;
  ShaderParser *pSVar5;
  string *psVar6;
  ExpectResult local_144;
  string source;
  string fragName;
  string caseName;
  string bothSource;
  string description;
  vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
  valueBlockList;
  string fragmentSource;
  string vertexSource;
  ShaderCase *local_38;
  
  assumeToken(this,TOKEN_CASE);
  advanceToken(this);
  caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
  pcVar2 = (this->m_curTokenStr)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&caseName,pcVar2,pcVar2 + (this->m_curTokenStr)._M_string_length);
  advanceToken(this);
  __rhs = &this->m_curTokenStr;
  valueBlockList.
  super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  valueBlockList.
  super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  valueBlockList.
  super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  description._M_dataplus._M_p = (pointer)&description.field_2;
  description._M_string_length = 0;
  description.field_2._M_local_buf[0] = '\0';
  bothSource._M_dataplus._M_p = (pointer)&bothSource.field_2;
  bothSource._M_string_length = 0;
  bothSource.field_2._M_local_buf[0] = '\0';
  vertexSource._M_dataplus._M_p = (pointer)&vertexSource.field_2;
  vertexSource._M_string_length = 0;
  vertexSource.field_2._M_local_buf[0] = '\0';
  fragmentSource._M_dataplus._M_p = (pointer)&fragmentSource.field_2;
  fragmentSource._M_string_length = 0;
  targetVersion = GLSL_VERSION_100_ES;
  fragmentSource.field_2._M_local_buf[0] = '\0';
  local_144 = EXPECT_PASS;
LAB_00db3c4a:
  do {
    TVar1 = this->m_curToken;
    switch(TVar1) {
    case TOKEN_DESC:
      advanceToken(this);
      pSVar5 = (ShaderParser *)0x2;
      assumeToken(this,TOKEN_STRING);
      parseStringLiteral_abi_cxx11_(&source,pSVar5,(__rhs->_M_dataplus)._M_p);
      std::__cxx11::string::operator=((string *)&description,(string *)&source);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)source._M_dataplus._M_p != &source.field_2) {
        operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
      }
      advanceToken(this);
      goto LAB_00db3c4a;
    case TOKEN_EXPECT:
      advanceToken(this);
      assumeToken(this,TOKEN_IDENTIFIER);
      iVar3 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar3 == 0) {
        local_144 = EXPECT_PASS;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar3 == 0) {
          local_144 = EXPECT_COMPILE_FAIL;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)__rhs);
          local_144 = EXPECT_LINK_FAIL;
          if (iVar3 != 0) goto LAB_00db439f;
        }
      }
      advanceToken(this);
      goto LAB_00db3c4a;
    case TOKEN_GROUP:
    case TOKEN_CASE:
switchD_00db3c61_caseD_b:
      std::operator+(&source,"unexpected token while parsing shader case: ",__rhs);
      parseError(this,&source);
LAB_00db439f:
      std::operator+(&source,"invalid expected result value: ",__rhs);
      parseError(this,&source);
LAB_00db43c0:
      fragName._M_dataplus._M_p = (pointer)&fragName.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&fragName,"Unknown GLSL version","")
      ;
      parseError(this,&fragName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fragName._M_dataplus._M_p != &fragName.field_2) {
        operator_delete(fragName._M_dataplus._M_p,fragName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)source._M_dataplus._M_p != &source.field_2) {
        operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fragmentSource._M_dataplus._M_p != &fragmentSource.field_2) {
        operator_delete(fragmentSource._M_dataplus._M_p,
                        CONCAT71(fragmentSource.field_2._M_allocated_capacity._1_7_,
                                 fragmentSource.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)vertexSource._M_dataplus._M_p != &vertexSource.field_2) {
        operator_delete(vertexSource._M_dataplus._M_p,
                        CONCAT71(vertexSource.field_2._M_allocated_capacity._1_7_,
                                 vertexSource.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)bothSource._M_dataplus._M_p != &bothSource.field_2) {
        operator_delete(bothSource._M_dataplus._M_p,
                        CONCAT71(bothSource.field_2._M_allocated_capacity._1_7_,
                                 bothSource.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p != &description.field_2) {
        operator_delete(description._M_dataplus._M_p,
                        CONCAT71(description.field_2._M_allocated_capacity._1_7_,
                                 description.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>::
      ~vector(&valueBlockList);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)caseName._M_dataplus._M_p != &caseName.field_2) {
        operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(extraout_RAX);
    case TOKEN_END:
      assumeToken(this,TOKEN_END);
      advanceToken(this);
      if (bothSource._M_string_length == 0) {
        pSVar4 = (ShaderCase *)operator_new(0xe0);
        ShaderCase::ShaderCase
                  (pSVar4,this->m_testCtx,this->m_renderCtx,caseName._M_dataplus._M_p,
                   description._M_dataplus._M_p,local_144,&valueBlockList,targetVersion,
                   vertexSource._M_dataplus._M_p,fragmentSource._M_dataplus._M_p);
        source._M_dataplus._M_p = (pointer)pSVar4;
        std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
                  ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)shaderNodeList,
                   (TestNode **)&source);
      }
      else {
        source._M_dataplus._M_p = (pointer)&source.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&source,caseName._M_dataplus._M_p,
                   caseName._M_dataplus._M_p + caseName._M_string_length);
        std::__cxx11::string::append((char *)&source);
        fragName._M_dataplus._M_p = (pointer)&fragName.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&fragName,caseName._M_dataplus._M_p,
                   caseName._M_dataplus._M_p + caseName._M_string_length);
        std::__cxx11::string::append((char *)&fragName);
        pSVar4 = (ShaderCase *)operator_new(0xe0);
        ShaderCase::ShaderCase
                  (pSVar4,this->m_testCtx,this->m_renderCtx,source._M_dataplus._M_p,
                   description._M_dataplus._M_p,local_144,&valueBlockList,targetVersion,
                   bothSource._M_dataplus._M_p,(char *)0x0);
        local_38 = pSVar4;
        std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
                  ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)shaderNodeList,
                   (TestNode **)&local_38);
        pSVar4 = (ShaderCase *)operator_new(0xe0);
        ShaderCase::ShaderCase
                  (pSVar4,this->m_testCtx,this->m_renderCtx,fragName._M_dataplus._M_p,
                   description._M_dataplus._M_p,local_144,&valueBlockList,targetVersion,(char *)0x0,
                   bothSource._M_dataplus._M_p);
        local_38 = pSVar4;
        std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
                  ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)shaderNodeList,
                   (TestNode **)&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fragName._M_dataplus._M_p != &fragName.field_2) {
          operator_delete(fragName._M_dataplus._M_p,fragName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)source._M_dataplus._M_p != &source.field_2) {
          operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fragmentSource._M_dataplus._M_p != &fragmentSource.field_2) {
        operator_delete(fragmentSource._M_dataplus._M_p,
                        CONCAT71(fragmentSource.field_2._M_allocated_capacity._1_7_,
                                 fragmentSource.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)vertexSource._M_dataplus._M_p != &vertexSource.field_2) {
        operator_delete(vertexSource._M_dataplus._M_p,
                        CONCAT71(vertexSource.field_2._M_allocated_capacity._1_7_,
                                 vertexSource.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)bothSource._M_dataplus._M_p != &bothSource.field_2) {
        operator_delete(bothSource._M_dataplus._M_p,
                        CONCAT71(bothSource.field_2._M_allocated_capacity._1_7_,
                                 bothSource.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p != &description.field_2) {
        operator_delete(description._M_dataplus._M_p,
                        CONCAT71(description.field_2._M_allocated_capacity._1_7_,
                                 description.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>::
      ~vector(&valueBlockList);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)caseName._M_dataplus._M_p != &caseName.field_2) {
        operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
      }
      return;
    case TOKEN_VALUES:
      source._M_string_length = 0;
      source.field_2._M_allocated_capacity = 0;
      source.field_2._8_8_ = 0;
      source._M_dataplus._M_p = source._M_dataplus._M_p & 0xffffffff00000000;
      parseValueBlock(this,(ValueBlock *)&source);
      std::
      vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>::
      push_back(&valueBlockList,(value_type *)&source);
      std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>::
      ~vector((vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_> *)
              &source._M_string_length);
      goto LAB_00db3c4a;
    case TOKEN_BOTH:
    case TOKEN_VERTEX:
    case TOKEN_FRAGMENT:
      advanceToken(this);
      pSVar5 = (ShaderParser *)0x3;
      assumeToken(this,TOKEN_SHADER_SOURCE);
      parseShaderSource_abi_cxx11_(&source,pSVar5,(__rhs->_M_dataplus)._M_p);
      advanceToken(this);
      if (TVar1 == TOKEN_FRAGMENT) {
        psVar6 = &fragmentSource;
      }
      else {
        psVar6 = &vertexSource;
        if (TVar1 != TOKEN_VERTEX) {
          if (TVar1 != TOKEN_BOTH) break;
          psVar6 = &bothSource;
        }
      }
      std::__cxx11::string::_M_assign((string *)psVar6);
      break;
    default:
      if (TVar1 != TOKEN_VERSION) goto switchD_00db3c61_caseD_b;
      advanceToken(this);
      source._M_dataplus._M_p = (pointer)&source.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&source,0x1b3c1e9);
      assumeToken(this,TOKEN_INT_LITERAL);
      iVar3 = atoi((this->m_curTokenStr)._M_dataplus._M_p);
      advanceToken(this);
      if (this->m_curToken == TOKEN_IDENTIFIER) {
        std::__cxx11::string::_M_assign((string *)&source);
        advanceToken(this);
      }
      if (iVar3 < 0x14a) {
        targetVersion = GLSL_VERSION_130;
        if (iVar3 < 0x96) {
          if (iVar3 == 100) {
            iVar3 = std::__cxx11::string::compare((char *)&source);
            if (iVar3 != 0) goto LAB_00db43c0;
            targetVersion = GLSL_VERSION_100_ES;
          }
          else if (iVar3 != 0x82) {
            if (iVar3 != 0x8c) goto LAB_00db43c0;
            targetVersion = GLSL_VERSION_140;
          }
        }
        else if (iVar3 == 0x96) {
          targetVersion = GLSL_VERSION_150;
        }
        else if (iVar3 == 300) {
          iVar3 = std::__cxx11::string::compare((char *)&source);
          if (iVar3 != 0) goto LAB_00db43c0;
          targetVersion = GLSL_VERSION_300_ES;
        }
        else {
          if ((iVar3 != 0x136) ||
             (iVar3 = std::__cxx11::string::compare((char *)&source), iVar3 != 0))
          goto LAB_00db43c0;
          targetVersion = GLSL_VERSION_310_ES;
        }
      }
      else if (iVar3 < 0x1a4) {
        if (iVar3 == 0x14a) {
          targetVersion = GLSL_VERSION_330;
        }
        else if (iVar3 == 400) {
          targetVersion = GLSL_VERSION_400;
        }
        else {
          if (iVar3 != 0x19a) goto LAB_00db43c0;
          targetVersion = GLSL_VERSION_410;
        }
      }
      else if (iVar3 < 0x1b8) {
        if (iVar3 == 0x1a4) {
          targetVersion = GLSL_VERSION_420;
        }
        else {
          if (iVar3 != 0x1ae) goto LAB_00db43c0;
          targetVersion = GLSL_VERSION_430;
        }
      }
      else if (iVar3 == 0x1b8) {
        targetVersion = GLSL_VERSION_440;
      }
      else {
        if (iVar3 != 0x1c2) goto LAB_00db43c0;
        targetVersion = GLSL_VERSION_450;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p != &source.field_2) {
      operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
    }
  } while( true );
}

Assistant:

void ShaderParser::parseShaderCase(vector<tcu::TestNode*>& shaderNodeList)
{
	// Parse 'case'.
	PARSE_DBG(("  parseShaderCase()\n"));
	advanceToken(TOKEN_CASE);

	// Parse case name.
	string caseName = m_curTokenStr;
	advanceToken(); // \note [pyry] All token types are allowed here.

	// Setup case.
	vector<ShaderCase::ValueBlock> valueBlockList;

	GLSLVersion				 version	  = DEFAULT_GLSL_VERSION;
	ShaderCase::ExpectResult expectResult = ShaderCase::EXPECT_PASS;
	string					 description;
	string					 bothSource;
	string					 vertexSource;
	string					 fragmentSource;

	for (;;)
	{
		if (m_curToken == TOKEN_END)
			break;
		else if (m_curToken == TOKEN_DESC)
		{
			advanceToken();
			assumeToken(TOKEN_STRING);

			description = parseStringLiteral(m_curTokenStr.c_str());
			advanceToken();
		}
		else if (m_curToken == TOKEN_EXPECT)
		{
			advanceToken();
			assumeToken(TOKEN_IDENTIFIER);

			if (m_curTokenStr == "pass")
				expectResult = ShaderCase::EXPECT_PASS;
			else if (m_curTokenStr == "compile_fail")
				expectResult = ShaderCase::EXPECT_COMPILE_FAIL;
			else if (m_curTokenStr == "link_fail")
				expectResult = ShaderCase::EXPECT_LINK_FAIL;
			else
				parseError(string("invalid expected result value: " + m_curTokenStr));

			advanceToken();
		}
		else if (m_curToken == TOKEN_VALUES)
		{
			ShaderCase::ValueBlock block;
			parseValueBlock(block);
			valueBlockList.push_back(block);
		}
		else if (m_curToken == TOKEN_BOTH || m_curToken == TOKEN_VERTEX || m_curToken == TOKEN_FRAGMENT)
		{
			Token token = m_curToken;
			advanceToken();
			assumeToken(TOKEN_SHADER_SOURCE);
			string source = parseShaderSource(m_curTokenStr.c_str());
			advanceToken();
			if (token == TOKEN_BOTH)
				bothSource = source;
			else if (token == TOKEN_VERTEX)
				vertexSource = source;
			else if (token == TOKEN_FRAGMENT)
				fragmentSource = source;
			else
				DE_ASSERT(DE_FALSE);
		}
		else if (m_curToken == TOKEN_VERSION)
		{
			advanceToken();

			int			versionNum = 0;
			std::string postfix	= "";

			assumeToken(TOKEN_INT_LITERAL);
			versionNum = parseIntLiteral(m_curTokenStr.c_str());
			advanceToken();

			if (m_curToken == TOKEN_IDENTIFIER)
			{
				postfix = m_curTokenStr;
				advanceToken();
			}

			if (versionNum == 100 && postfix == "es")
				version = glu::GLSL_VERSION_100_ES;
			else if (versionNum == 300 && postfix == "es")
				version = glu::GLSL_VERSION_300_ES;
			else if (versionNum == 310 && postfix == "es")
				version = glu::GLSL_VERSION_310_ES;
			else if (versionNum == 130)
				version = glu::GLSL_VERSION_130;
			else if (versionNum == 140)
				version = glu::GLSL_VERSION_140;
			else if (versionNum == 150)
				version = glu::GLSL_VERSION_150;
			else if (versionNum == 330)
				version = glu::GLSL_VERSION_330;
			else if (versionNum == 400)
				version = glu::GLSL_VERSION_400;
			else if (versionNum == 410)
				version = glu::GLSL_VERSION_410;
			else if (versionNum == 420)
				version = glu::GLSL_VERSION_420;
			else if (versionNum == 430)
				version = glu::GLSL_VERSION_430;
			else if (versionNum == 440)
				version = glu::GLSL_VERSION_440;
			else if (versionNum == 450)
				version = glu::GLSL_VERSION_450;
			else
				parseError("Unknown GLSL version");
		}
		else
			parseError(string("unexpected token while parsing shader case: " + m_curTokenStr));
	}

	advanceToken(TOKEN_END); // case end

	if (bothSource.length() > 0)
	{
		DE_ASSERT(vertexSource.length() == 0);
		DE_ASSERT(fragmentSource.length() == 0);

		string vertName = caseName + "_vertex";
		string fragName = caseName + "_fragment";
		shaderNodeList.push_back(new ShaderCase(m_testCtx, m_renderCtx, vertName.c_str(), description.c_str(),
												expectResult, valueBlockList, version, bothSource.c_str(), DE_NULL));
		shaderNodeList.push_back(new ShaderCase(m_testCtx, m_renderCtx, fragName.c_str(), description.c_str(),
												expectResult, valueBlockList, version, DE_NULL, bothSource.c_str()));
	}
	else
	{
		shaderNodeList.push_back(new ShaderCase(m_testCtx, m_renderCtx, caseName.c_str(), description.c_str(),
												expectResult, valueBlockList, version, vertexSource.c_str(),
												fragmentSource.c_str()));
	}
}